

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O2

int __thiscall QDateTimeEditPrivate::init(QDateTimeEditPrivate *this,EVP_PKEY_CTX *ctx)

{
  QWidget *this_00;
  undefined4 uVar1;
  int iVar2;
  char *pcVar3;
  long in_FS_OFFSET;
  QLatin1StringView latin1;
  qsizetype qStack_70;
  QTime local_60;
  undefined8 local_58;
  undefined1 local_50 [8];
  QVariant local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QAbstractSpinBoxPrivate).super_QWidgetPrivate.field_0x8;
  QDate::QDate((QDate *)&local_48,2000,1,1);
  uVar1 = QDate::year();
  *(undefined4 *)&this->field_0x3e4 = uVar1;
  iVar2 = ::QVariant::typeId((QVariant *)ctx);
  if (iVar2 == 0x10) {
    ::QVariant::operator=(&(this->super_QAbstractSpinBoxPrivate).value,(QVariant *)ctx);
    updateTimeZone(this);
    QDateTimeEdit::setDisplayFormat((QDateTimeEdit *)this_00,&this->defaultDateTimeFormat);
    if (*(long *)&this->field_0x418 != 0) goto LAB_003bdffd;
    pcVar3 = "dd/MM/yyyy hh:mm:ss";
    qStack_70 = 0x13;
  }
  else if (iVar2 == 0xf) {
    QDate::QDate((QDate *)&local_60,2000,1,1);
    ::QVariant::toTime();
    dateTimeValue((QDateTimeEditPrivate *)local_50,(QDate)this,local_60);
    ::QVariant::QVariant(&local_48,(QDateTime *)local_50);
    ::QVariant::operator=(&(this->super_QAbstractSpinBoxPrivate).value,&local_48);
    ::QVariant::~QVariant(&local_48);
    QDateTime::~QDateTime((QDateTime *)local_50);
    updateTimeZone(this);
    QDateTimeEdit::setDisplayFormat((QDateTimeEdit *)this_00,&this->defaultTimeFormat);
    if (*(long *)&this->field_0x418 != 0) goto LAB_003bdffd;
    pcVar3 = "hh:mm:ss";
    qStack_70 = 8;
  }
  else {
    if (iVar2 != 0xe) goto LAB_003bdffd;
    local_58 = ::QVariant::toDate();
    QDate::startOfDay((QTimeZone *)local_50);
    ::QVariant::QVariant(&local_48,(QDateTime *)local_50);
    ::QVariant::operator=(&(this->super_QAbstractSpinBoxPrivate).value,&local_48);
    ::QVariant::~QVariant(&local_48);
    QDateTime::~QDateTime((QDateTime *)local_50);
    updateTimeZone(this);
    QDateTimeEdit::setDisplayFormat((QDateTimeEdit *)this_00,&this->defaultDateFormat);
    if (*(long *)&this->field_0x418 != 0) goto LAB_003bdffd;
    pcVar3 = "dd/MM/yyyy";
    qStack_70 = 10;
  }
  latin1.m_data = pcVar3;
  latin1.m_size = qStack_70;
  QString::QString((QString *)&local_48,latin1);
  QDateTimeEdit::setDisplayFormat((QDateTimeEdit *)this_00,(QString *)&local_48);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_48);
LAB_003bdffd:
  QWidget::setInputMethodHints(this_00,(InputMethodHints)0x8);
  QWidgetPrivate::setLayoutItemMargins
            ((QWidgetPrivate *)this,SE_DateTimeEditLayoutItem,(QStyleOption *)0x0);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QDateTimeEditPrivate::init(const QVariant &var)
{
    Q_Q(QDateTimeEdit);
    defaultCenturyStart = QDATETIMEEDIT_DATE_INITIAL.year();
    switch (var.userType()) {
    case QMetaType::QDate:
        value = var.toDate().startOfDay(timeZone);
        updateTimeZone();
        q->setDisplayFormat(defaultDateFormat);
        if (sectionNodes.isEmpty()) // ### safeguard for broken locale
            q->setDisplayFormat("dd/MM/yyyy"_L1);
        break;
    case QMetaType::QDateTime:
        value = var;
        updateTimeZone();
        q->setDisplayFormat(defaultDateTimeFormat);
        if (sectionNodes.isEmpty()) // ### safeguard for broken locale
            q->setDisplayFormat("dd/MM/yyyy hh:mm:ss"_L1);
        break;
    case QMetaType::QTime:
        value = dateTimeValue(QDATETIMEEDIT_DATE_INITIAL, var.toTime());
        updateTimeZone();
        q->setDisplayFormat(defaultTimeFormat);
        if (sectionNodes.isEmpty()) // ### safeguard for broken locale
            q->setDisplayFormat("hh:mm:ss"_L1);
        break;
    default:
        Q_ASSERT_X(0, "QDateTimeEditPrivate::init", "Internal error");
        break;
    }
#ifdef QT_KEYPAD_NAVIGATION
    if (QApplicationPrivate::keypadNavigationEnabled())
        q->setCalendarPopup(true);
#endif
    q->setInputMethodHints(Qt::ImhPreferNumbers);
    setLayoutItemMargins(QStyle::SE_DateTimeEditLayoutItem);
}